

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O0

void __thiscall
insyde_fdm_t::fdm_entries_t::fdm_entries_t
          (fdm_entries_t *this,kstream *p__io,insyde_fdm_t *p__parent,insyde_fdm_t *p__root)

{
  insyde_fdm_t *p__root_local;
  insyde_fdm_t *p__parent_local;
  kstream *p__io_local;
  fdm_entries_t *this_local;
  
  kaitai::kstruct::kstruct(&this->super_kstruct,p__io);
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__fdm_entries_t_00228f10;
  std::
  unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>>>>>
  ::
  unique_ptr<std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>>>>,void>
            ((unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>>>,std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,std::default_delete<insyde_fdm_t::fdm_entry_t>>>>>>
              *)&this->m_entries);
  this->m__parent = p__parent;
  this->m__root = p__root;
  std::
  unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_entry_t,_std::default_delete<insyde_fdm_t::fdm_entry_t>_>_>_>_>_>
  ::operator=(&this->m_entries,(nullptr_t)0x0);
  _read(this);
  return;
}

Assistant:

insyde_fdm_t::fdm_entries_t::fdm_entries_t(kaitai::kstream* p__io, insyde_fdm_t* p__parent, insyde_fdm_t* p__root) : kaitai::kstruct(p__io) {
    m__parent = p__parent;
    m__root = p__root;
    m_entries = nullptr;
    _read();
}